

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O1

uint __thiscall
Kernel::Signature::addFreshFunction(Signature *this,uint arity,char *prefix,char *suffix)

{
  undefined1 *puVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long lVar6;
  bool added;
  string suf;
  string pref;
  bool local_f1;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,prefix,(allocator<char> *)&local_f0);
  if (suffix == (char *)0x0) {
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    lVar6 = extraout_RDX;
  }
  else {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"_","");
    plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
    local_f0 = &local_e0;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar3[3];
    }
    else {
      local_e0 = *plVar4;
      local_f0 = (long *)*plVar3;
    }
    lVar6 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_e8 = lVar6;
  }
  if ((suffix != (char *)0x0) && (local_70[0] != local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
    lVar6 = extraout_RDX_00;
  }
  do {
    uVar2 = this->_nextFreshSymbolNumber;
    this->_nextFreshSymbolNumber = uVar2 + 1;
    ::Lib::Int::toString_abi_cxx11_(&local_90,(Int *)(ulong)uVar2,(int)lVar6);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_90,0,(char *)0x0,(ulong)local_50[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_c0 = *plVar4;
      lStack_b8 = plVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar4;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar2 = addFunction(this,&local_b0,arity,&local_f1);
    lVar6 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      lVar6 = extraout_RDX_02;
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
      lVar6 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      lVar6 = extraout_RDX_04;
    }
  } while (local_f1 != true);
  puVar1 = &(this->_funs)._stack[uVar2]->field_0x40;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x14;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return uVar2;
}

Assistant:

unsigned Signature::addFreshFunction(unsigned arity, const char* prefix, const char* suffix)
{
  std::string pref(prefix);
  std::string suf(suffix ? std::string("_")+suffix : "");
  bool added;
  unsigned result;
  //commented out because it could lead to introduction of function with the same name
  //that differ only in arity (which is OK with tptp, but iProver was complaining when
  //using Vampire as clausifier)
//  unsigned result = addFunction(pref+suf,arity,added);
//  if (!added) {
    do {
      result = addFunction(pref+Int::toString(_nextFreshSymbolNumber++)+suf,arity,added);
    }
    while (!added);
//  }
  Symbol* sym = getFunction(result);
  sym->markIntroduced();
  sym->markSkip();
  return result;
}